

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z-util.c
# Opt level: O1

_Bool mul_u16n(uint16_t *r,uint16_t *a,uint16_t *b,size_t nr,size_t na,size_t nb)

{
  ushort uVar1;
  ushort uVar2;
  _Bool _Var3;
  _Bool _Var4;
  long lVar5;
  size_t sVar6;
  ulong uVar7;
  long lVar8;
  size_t sVar9;
  long lVar10;
  size_t sVar11;
  uint uVar12;
  uint uVar13;
  
  if (nr != 0) {
    memset(r,0,nr * 2);
  }
  if (na == 0) {
    _Var4 = false;
  }
  else {
    lVar5 = (nr - nb) + -2;
    _Var4 = false;
    sVar6 = na;
    do {
      lVar8 = na - sVar6;
      sVar6 = sVar6 - 1;
      sVar9 = nb;
      do {
        if (sVar9 == 0) break;
        uVar7 = (nb - sVar9) + lVar8;
        sVar11 = sVar9;
        _Var3 = true;
        if (uVar7 < nr) {
          sVar11 = sVar9 - 1;
          uVar1 = a[sVar6];
          uVar2 = b[sVar9 - 1];
          uVar12 = ((uint)uVar2 * (uint)uVar1 & 0xffff) + (uint)r[~uVar7 + nr];
          r[~uVar7 + nr] = (uint16_t)uVar12;
          uVar12 = (uVar12 >> 0x10) + ((uint)uVar2 * (uint)uVar1 >> 0x10);
          _Var3 = _Var4;
          if (uVar12 != 0) {
            lVar10 = sVar9 + lVar5;
            do {
              _Var3 = true;
              if (lVar10 == -1) break;
              uVar13 = uVar12 + r[lVar10];
              r[lVar10] = (uint16_t)uVar13;
              uVar12 = uVar13 >> 0x10;
              lVar10 = lVar10 + -1;
              _Var3 = _Var4;
            } while (0xffff < uVar13);
          }
        }
        _Var4 = _Var3;
        sVar9 = sVar11;
      } while (uVar7 < nr);
      lVar5 = lVar5 + -1;
    } while (sVar6 != 0);
  }
  return _Var4;
}

Assistant:

static bool mul_u16n(uint16_t *r, const uint16_t *a, const uint16_t *b,
		size_t nr, size_t na, size_t nb)
{
	const uint32_t mask = ((uint32_t)1 << 16) - 1;
	size_t ia = na;
	bool over = false;

	zer_u16n(r, nr);
	while (ia > 0) {
		size_t ib = nb;

		--ia;
		while (ib > 0) {
			size_t rir = (na - 1 - ia) + (nb - ib), ir;
			uint32_t p, carry, t;

			if (rir >= nr) {
				over = true;
				break;
			}
			--ib;
			ir = (nr - rir) - 1;
			p = (uint32_t)a[ia] * (uint32_t)b[ib];
			carry = p >> 16;
			t = (uint32_t)r[ir] + (p & mask);
			r[ir] = t & mask;
			carry += t >> 16;
			while (carry > 0) {
				if (ir == 0) {
					over = true;
					break;
				}
				--ir;
				t = (uint32_t)r[ir] + carry;
				r[ir] = t & mask;
				carry = t >> 16;
			}
		}
	}
	return over;
}